

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createTexture_scale(SemanticParser *this,SP *in)

{
  long lVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar5;
  SP SVar6;
  SP tex;
  allocator<char> local_99;
  string local_98;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  
  std::make_shared<pbrt::ScaleTexture>();
  lVar1 = *in_RDX;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"tex1",(allocator<char> *)&stack0xffffffffffffff88);
  bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)(lVar1 + 8),&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (bVar4) {
    lVar1 = *in_RDX;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"tex1",&local_99);
    syntactic::ParamSet::getParamTexture((ParamSet *)&stack0xffffffffffffffc0,(string *)(lVar1 + 8))
    ;
    findOrCreateTexture((SemanticParser *)&stack0xffffffffffffff88,in);
    std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)
               &(local_68->cameras).
                super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  else {
    lVar1 = *in_RDX;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"tex1",(allocator<char> *)&stack0xffffffffffffff88);
    bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar1 + 8),&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    peVar2 = local_68;
    lVar1 = *in_RDX;
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"tex1",(allocator<char> *)&stack0xffffffffffffff88);
      syntactic::ParamSet::getParam3f
                ((ParamSet *)(lVar1 + 8),
                 (float *)&(((SP *)&peVar2->sampler)->
                           super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                 &local_98);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"tex1",(allocator<char> *)&stack0xffffffffffffff88);
      fVar5 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar1 + 8),&local_98,0.0);
      *(float *)&(((SP *)&local_68->sampler)->
                 super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           fVar5;
      *(float *)((long)&(((SP *)&local_68->sampler)->
                        super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                        _M_pi + 4) = fVar5;
      *(float *)&(((SP *)&local_68->integrator)->
                 super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = fVar5;
    }
  }
  std::__cxx11::string::~string((string *)&local_98);
  lVar1 = *in_RDX;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"tex2",(allocator<char> *)&stack0xffffffffffffff88);
  bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)(lVar1 + 8),&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (bVar4) {
    lVar1 = *in_RDX;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"tex2",&local_99);
    syntactic::ParamSet::getParamTexture((ParamSet *)&stack0xffffffffffffffb0,(string *)(lVar1 + 8))
    ;
    findOrCreateTexture((SemanticParser *)&stack0xffffffffffffff88,in);
    std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)
               &(local_68->film).
                super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
  }
  else {
    lVar1 = *in_RDX;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"tex2",(allocator<char> *)&stack0xffffffffffffff88);
    bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar1 + 8),&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    peVar2 = local_68;
    lVar1 = *in_RDX;
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"tex2",(allocator<char> *)&stack0xffffffffffffff88);
      syntactic::ParamSet::getParam3f
                ((ParamSet *)(lVar1 + 8),
                 (float *)((long)&(((SP *)&peVar2->integrator)->
                                  super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr + 4),&local_98);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"tex2",(allocator<char> *)&stack0xffffffffffffff88);
      fVar5 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar1 + 8),&local_98,0.0);
      *(float *)((long)&(((SP *)&local_68->integrator)->
                        super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 4) =
           fVar5;
      *(float *)&(((SP *)&local_68->integrator)->
                 super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           fVar5;
      *(float *)((long)&(((SP *)&local_68->integrator)->
                        super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                        _M_pi + 4) = fVar5;
    }
  }
  std::__cxx11::string::~string((string *)&local_98);
  _Var3._M_pi = _Stack_60._M_pi;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  local_68 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffa0);
  SVar6.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar6.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar6.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_scale(pbrt::syntactic::Texture::SP in)
  {
    ScaleTexture::SP tex = std::make_shared<ScaleTexture>();
    if (in->hasParamTexture("tex1"))
      tex->tex1 = findOrCreateTexture(in->getParamTexture("tex1"));
    else if (in->hasParam3f("tex1"))
      in->getParam3f(&tex->scale1.x,"tex1");
    else
      tex->scale1 = vec3f(in->getParam1f("tex1"));
          
    if (in->hasParamTexture("tex2"))
      tex->tex2 = findOrCreateTexture(in->getParamTexture("tex2"));
    else if (in->hasParam3f("tex2"))
      in->getParam3f(&tex->scale2.x,"tex2");
    else
      tex->scale2 = vec3f(in->getParam1f("tex2"));
    return tex;
  }